

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O0

val eval(c2m_ctx_t c2m_ctx,node_t_conflict tree)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  node_t_conflict pnVar4;
  char *pcVar5;
  bool bVar6;
  pos_t pVar7;
  val vVar8;
  uint local_174;
  uint local_164;
  long local_150;
  long local_148;
  ulong local_140;
  ulong local_138;
  undefined4 uStack_e4;
  undefined4 uStack_c4;
  char *local_b8;
  undefined8 local_b0;
  int zero_p;
  char *local_60;
  undefined8 local_58;
  undefined1 local_50 [8];
  val v2;
  val v1;
  int cond;
  node_t_conflict tree_local;
  c2m_ctx_t c2m_ctx_local;
  val res;
  
  switch(tree->code) {
  case N_IGNORE:
    pVar7 = get_node_pos(c2m_ctx,tree);
    local_60 = pVar7.fname;
    local_58 = pVar7._8_8_;
    error(c2m_ctx,0x1d7adc,local_60,local_58);
    c2m_ctx_local = (c2m_ctx_t)0x0;
    res.uns_p = 0;
    res._4_4_ = 0;
    break;
  case N_I:
  case N_L:
    c2m_ctx_local = (c2m_ctx_t)0x0;
    res._0_8_ = (tree->u).s.s;
    break;
  case N_LL:
    c2m_ctx_local = (c2m_ctx_t)0x0;
    res._0_8_ = (tree->u).s.s;
    break;
  case N_U:
  case N_UL:
    c2m_ctx_local = (c2m_ctx_t)&DAT_00000001;
    res._0_8_ = (tree->u).s.s;
    break;
  case N_ULL:
    c2m_ctx_local = (c2m_ctx_t)&DAT_00000001;
    res._0_8_ = (tree->u).s.s;
    break;
  default:
    __assert_fail("FALSE",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                  ,0xddc,"struct val eval(c2m_ctx_t, node_t)");
  case N_CH:
    iVar2 = char_is_signed_p();
    c2m_ctx_local = (c2m_ctx_t)(ulong)(uint)(iVar2 == 0);
    if ((iVar2 == 0) == 0) {
      cVar1 = (tree->u).ch;
    }
    else {
      cVar1 = (tree->u).ch;
    }
    res._0_8_ = SEXT18(cVar1);
    break;
  case N_CH16:
  case N_CH32:
    c2m_ctx_local = (c2m_ctx_t)&DAT_00000001;
    res._0_8_ = (tree->u).s.s;
    break;
  case N_ANDAND:
  case N_OROR:
    pnVar4 = DLIST_node_t_head(&(tree->u).ops);
    vVar8 = eval(c2m_ctx,pnVar4);
    v2.u.i_val._4_4_ = uStack_c4;
    v2.u.i_val._0_4_ = vVar8.uns_p;
    local_164 = (uint)(vVar8.u.i_val != 0);
    v1.u.i_val._4_4_ = local_164;
    if (tree->code == N_ANDAND) {
      if (local_164 != 0) {
LAB_0019ee8e:
        pnVar4 = DLIST_node_t_el(&(tree->u).ops,1);
        vVar8 = eval(c2m_ctx,pnVar4);
        local_174 = (uint)(vVar8.u.i_val != 0);
        v1.u.i_val._4_4_ = local_174;
      }
    }
    else if (local_164 == 0) goto LAB_0019ee8e;
    c2m_ctx_local = (c2m_ctx_t)0x0;
    res._0_8_ = SEXT48((int)v1.u.i_val._4_4_);
    break;
  case N_EQ:
    uVar3 = eval_binop_operands(c2m_ctx,tree,(val *)&v2.u,(val *)local_50);
    c2m_ctx_local = (c2m_ctx_t)(ulong)uVar3;
    res._0_8_ = SEXT48((int)(uint)(v1._0_8_ == v2._0_8_));
    break;
  case N_NE:
    uVar3 = eval_binop_operands(c2m_ctx,tree,(val *)&v2.u,(val *)local_50);
    c2m_ctx_local = (c2m_ctx_t)(ulong)uVar3;
    res._0_8_ = SEXT48((int)(uint)(v1._0_8_ != v2._0_8_));
    break;
  case N_LT:
    uVar3 = eval_binop_operands(c2m_ctx,tree,(val *)&v2.u,(val *)local_50);
    c2m_ctx_local = (c2m_ctx_t)(ulong)uVar3;
    if (uVar3 == 0) {
      bVar6 = (long)v1._0_8_ < (long)v2._0_8_;
    }
    else {
      bVar6 = (ulong)v1._0_8_ < (ulong)v2._0_8_;
    }
    res._0_8_ = SEXT48((int)(uint)bVar6);
    break;
  case N_LE:
    uVar3 = eval_binop_operands(c2m_ctx,tree,(val *)&v2.u,(val *)local_50);
    c2m_ctx_local = (c2m_ctx_t)(ulong)uVar3;
    if (uVar3 == 0) {
      bVar6 = (long)v1._0_8_ <= (long)v2._0_8_;
    }
    else {
      bVar6 = (ulong)v1._0_8_ <= (ulong)v2._0_8_;
    }
    res._0_8_ = SEXT48((int)(uint)bVar6);
    break;
  case N_GT:
    uVar3 = eval_binop_operands(c2m_ctx,tree,(val *)&v2.u,(val *)local_50);
    c2m_ctx_local = (c2m_ctx_t)(ulong)uVar3;
    if (uVar3 == 0) {
      bVar6 = (long)v2._0_8_ < (long)v1._0_8_;
    }
    else {
      bVar6 = (ulong)v2._0_8_ < (ulong)v1._0_8_;
    }
    res._0_8_ = SEXT48((int)(uint)bVar6);
    break;
  case N_GE:
    uVar3 = eval_binop_operands(c2m_ctx,tree,(val *)&v2.u,(val *)local_50);
    c2m_ctx_local = (c2m_ctx_t)(ulong)uVar3;
    if (uVar3 == 0) {
      bVar6 = (long)v2._0_8_ <= (long)v1._0_8_;
    }
    else {
      bVar6 = (ulong)v2._0_8_ <= (ulong)v1._0_8_;
    }
    res._0_8_ = SEXT48((int)(uint)bVar6);
    break;
  case N_BITWISE_NOT:
    pnVar4 = DLIST_node_t_head(&(tree->u).ops);
    vVar8 = eval(c2m_ctx,pnVar4);
    c2m_ctx_local = (c2m_ctx_t)(ulong)(uint)vVar8.uns_p;
    res._0_8_ = vVar8.u.u_val ^ 0xffffffffffffffff;
    break;
  case N_NOT:
    pnVar4 = DLIST_node_t_head(&(tree->u).ops);
    vVar8 = eval(c2m_ctx,pnVar4);
    c2m_ctx_local = (c2m_ctx_t)(ulong)(uint)vVar8.uns_p;
    res._0_8_ = SEXT48((int)(uint)((vVar8.u.i_val != 0 ^ 0xffU) & 1));
    break;
  case N_AND:
    uVar3 = eval_binop_operands(c2m_ctx,tree,(val *)&v2.u,(val *)local_50);
    c2m_ctx_local = (c2m_ctx_t)(ulong)uVar3;
    res._0_8_ = v1._0_8_ & v2._0_8_;
    break;
  case N_OR:
    uVar3 = eval_binop_operands(c2m_ctx,tree,(val *)&v2.u,(val *)local_50);
    c2m_ctx_local = (c2m_ctx_t)(ulong)uVar3;
    res._0_8_ = v1._0_8_ | v2._0_8_;
    break;
  case N_XOR:
    uVar3 = eval_binop_operands(c2m_ctx,tree,(val *)&v2.u,(val *)local_50);
    c2m_ctx_local = (c2m_ctx_t)(ulong)uVar3;
    res._0_8_ = v1._0_8_ ^ v2._0_8_;
    break;
  case N_LSH:
    uVar3 = eval_binop_operands(c2m_ctx,tree,(val *)&v2.u,(val *)local_50);
    c2m_ctx_local = (c2m_ctx_t)(ulong)uVar3;
    res._0_8_ = v1._0_8_ << ((byte)v2.uns_p & 0x3f);
    break;
  case N_RSH:
    uVar3 = eval_binop_operands(c2m_ctx,tree,(val *)&v2.u,(val *)local_50);
    c2m_ctx_local = (c2m_ctx_t)(ulong)uVar3;
    if (uVar3 == 0) {
      res._0_8_ = (long)v1._0_8_ >> ((byte)v2.uns_p & 0x3f);
    }
    else {
      res._0_8_ = (ulong)v1._0_8_ >> ((byte)v2.uns_p & 0x3f);
    }
    break;
  case N_ADD:
    pnVar4 = DLIST_node_t_el(&(tree->u).ops,1);
    if (pnVar4 == (node_t_conflict)0x0) {
      pnVar4 = DLIST_node_t_head(&(tree->u).ops);
      vVar8 = eval(c2m_ctx,pnVar4);
      res._0_8_ = vVar8.u;
      uVar3 = vVar8.uns_p;
    }
    else {
      uVar3 = eval_binop_operands(c2m_ctx,tree,(val *)&v2.u,(val *)local_50);
      res._0_8_ = v1._0_8_ + v2._0_8_;
    }
    c2m_ctx_local = (c2m_ctx_t)(ulong)uVar3;
    break;
  case N_SUB:
    pnVar4 = DLIST_node_t_el(&(tree->u).ops,1);
    if (pnVar4 == (node_t_conflict)0x0) {
      pnVar4 = DLIST_node_t_head(&(tree->u).ops);
      vVar8 = eval(c2m_ctx,pnVar4);
      uVar3 = vVar8.uns_p;
      res._0_8_ = -vVar8.u.i_val;
    }
    else {
      uVar3 = eval_binop_operands(c2m_ctx,tree,(val *)&v2.u,(val *)local_50);
      res._0_8_ = v1._0_8_ - v2._0_8_;
    }
    c2m_ctx_local = (c2m_ctx_t)(ulong)uVar3;
    break;
  case N_MUL:
    uVar3 = eval_binop_operands(c2m_ctx,tree,(val *)&v2.u,(val *)local_50);
    c2m_ctx_local = (c2m_ctx_t)(ulong)uVar3;
    res._0_8_ = v1._0_8_ * v2._0_8_;
    break;
  case N_DIV:
  case N_MOD:
    uVar3 = eval_binop_operands(c2m_ctx,tree,(val *)&v2.u,(val *)local_50);
    c2m_ctx_local = (c2m_ctx_t)(ulong)uVar3;
    if (uVar3 == 0) {
      if (v2._0_8_ == 0) {
        local_148 = 1;
      }
      else {
        if (tree->code == N_DIV) {
          local_150 = (long)v1._0_8_ / (long)v2._0_8_;
        }
        else {
          local_150 = (long)v1._0_8_ % (long)v2._0_8_;
        }
        local_148 = local_150;
      }
      res._0_8_ = local_148;
    }
    else {
      if (v2._0_8_ == 0) {
        local_138 = 1;
      }
      else {
        if (tree->code == N_DIV) {
          local_140 = (ulong)v1._0_8_ / (ulong)v2._0_8_;
        }
        else {
          local_140 = (ulong)v1._0_8_ % (ulong)v2._0_8_;
        }
        local_138 = local_140;
      }
      res._0_8_ = local_138;
    }
    if (v2._0_8_ == 0) {
      pVar7 = get_node_pos(c2m_ctx,tree);
      pcVar5 = "%";
      if (tree->code == N_DIV) {
        pcVar5 = "/";
      }
      local_b8 = pVar7.fname;
      local_b0 = pVar7._8_8_;
      error(c2m_ctx,0x1d7afa,local_b8,local_b0,pcVar5);
    }
    break;
  case N_COND:
    pnVar4 = DLIST_node_t_head(&(tree->u).ops);
    vVar8 = eval(c2m_ctx,pnVar4);
    v2.u.i_val._4_4_ = uStack_e4;
    v2.u.i_val._0_4_ = vVar8.uns_p;
    iVar2 = 2;
    if (vVar8.u.i_val != 0) {
      iVar2 = 1;
    }
    pnVar4 = DLIST_node_t_el(&(tree->u).ops,iVar2);
    vVar8 = eval(c2m_ctx,pnVar4);
    res._0_8_ = vVar8.u;
    c2m_ctx_local = (c2m_ctx_t)(ulong)(uint)vVar8.uns_p;
  }
  vVar8.u = (anon_union_8_2_027a474d_for_u)res._0_8_;
  vVar8._0_8_ = c2m_ctx_local;
  return vVar8;
}

Assistant:

static struct val eval (c2m_ctx_t c2m_ctx, node_t tree) {
  int cond;
  struct val res, v1, v2;

#define UNOP(op)                                \
  do {                                          \
    v1 = eval (c2m_ctx, NL_HEAD (tree->u.ops)); \
    res = v1;                                   \
    if (res.uns_p)                              \
      res.u.u_val = op res.u.u_val;             \
    else                                        \
      res.u.i_val = op res.u.i_val;             \
  } while (0)

#define BINOP(op)                                              \
  do {                                                         \
    res.uns_p = eval_binop_operands (c2m_ctx, tree, &v1, &v2); \
    if (res.uns_p)                                             \
      res.u.u_val = v1.u.u_val op v2.u.u_val;                  \
    else                                                       \
      res.u.i_val = v1.u.i_val op v2.u.i_val;                  \
  } while (0)

  switch (tree->code) {
  case N_IGNORE:
    error (c2m_ctx, POS (tree), "wrong preprocessor expression");
    res.uns_p = FALSE;
    res.u.i_val = 0;
    break;
  case N_CH:
    res.uns_p = !char_is_signed_p () || MIR_CHAR_MAX > MIR_INT_MAX;
    if (res.uns_p)
      res.u.u_val = tree->u.ch;
    else
      res.u.i_val = tree->u.ch;
    break;
  case N_CH16:
  case N_CH32:
    res.uns_p = TRUE;
    res.u.u_val = tree->u.ul;
    break;
  case N_I:
  case N_L:
    res.uns_p = FALSE;
    res.u.i_val = tree->u.l;
    break;
  case N_LL:
    res.uns_p = FALSE;
    res.u.i_val = tree->u.ll;
    break;
  case N_U:
  case N_UL:
    res.uns_p = TRUE;
    res.u.u_val = tree->u.ul;
    break;
  case N_ULL:
    res.uns_p = TRUE;
    res.u.u_val = tree->u.ull;
    break;
  case N_BITWISE_NOT: UNOP (~); break;
  case N_NOT: UNOP (!); break;
  case N_EQ: BINOP (==); break;
  case N_NE: BINOP (!=); break;
  case N_LT: BINOP (<); break;
  case N_LE: BINOP (<=); break;
  case N_GT: BINOP (>); break;
  case N_GE: BINOP (>=); break;
  case N_ADD:
    if (NL_EL (tree->u.ops, 1) == NULL) {
      UNOP (+);
    } else {
      BINOP (+);
    }
    break;
  case N_SUB:
    if (NL_EL (tree->u.ops, 1) == NULL) {
      UNOP (-);
    } else {
      BINOP (-);
    }
    break;
  case N_AND: BINOP (&); break;
  case N_OR: BINOP (|); break;
  case N_XOR: BINOP (^); break;
  case N_LSH: BINOP (<<); break;
  case N_RSH: BINOP (>>); break;
  case N_MUL: BINOP (*); break;
  case N_DIV:
  case N_MOD: {
    int zero_p;

    res.uns_p = eval_binop_operands (c2m_ctx, tree, &v1, &v2);
    if (res.uns_p) {
      res.u.u_val = ((zero_p = v2.u.u_val == 0) ? 1
                     : tree->code == N_DIV      ? v1.u.u_val / v2.u.u_val
                                                : v1.u.u_val % v2.u.u_val);
    } else {
      res.u.i_val = ((zero_p = v2.u.i_val == 0) ? 1
                     : tree->code == N_DIV      ? v1.u.i_val / v2.u.i_val
                                                : v1.u.i_val % v2.u.i_val);
    }
    if (zero_p)
      error (c2m_ctx, POS (tree), "division (%s) by zero in preporocessor",
             tree->code == N_DIV ? "/" : "%");
    break;
  }
  case N_ANDAND:
  case N_OROR:
    v1 = eval (c2m_ctx, NL_HEAD (tree->u.ops));
    cond = v1.uns_p ? v1.u.u_val != 0 : v1.u.i_val != 0;
    if (tree->code == N_ANDAND ? cond : !cond) {
      v2 = eval (c2m_ctx, NL_EL (tree->u.ops, 1));
      cond = v2.uns_p ? v2.u.u_val != 0 : v2.u.i_val != 0;
    }
    res.uns_p = FALSE;
    res.u.i_val = cond;
    break;
  case N_COND:
    v1 = eval (c2m_ctx, NL_HEAD (tree->u.ops));
    cond = v1.uns_p ? v1.u.u_val != 0 : v1.u.i_val != 0;
    res = eval (c2m_ctx, NL_EL (tree->u.ops, cond ? 1 : 2));
    break;
  default:
    res.uns_p = FALSE;
    res.u.i_val = 0;
    assert (FALSE);
  }
  return res;
}